

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tls.cpp
# Opt level: O0

void __thiscall xmrig::Client::Tls::Tls(Tls *this,Client *client)

{
  SSL_METHOD *meth;
  SSL_CTX *pSVar1;
  BIO_METHOD *pBVar2;
  BIO *pBVar3;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *(undefined1 *)(in_RDI + 2) = 0;
  memset((void *)((long)in_RDI + 0x11),0,0x800);
  memset((void *)((long)in_RDI + 0x811),0,0x48);
  in_RDI[0x10c] = in_RSI;
  in_RDI[0x10d] = 0;
  meth = (SSL_METHOD *)TLS_method();
  pSVar1 = SSL_CTX_new(meth);
  in_RDI[0x10e] = pSVar1;
  if (in_RDI[0x10e] != 0) {
    pBVar2 = BIO_s_mem();
    pBVar3 = BIO_new(pBVar2);
    in_RDI[1] = pBVar3;
    pBVar2 = BIO_s_mem();
    pBVar3 = BIO_new(pBVar2);
    *in_RDI = pBVar3;
    SSL_CTX_set_options(in_RDI[0x10e],0x2000000);
  }
  return;
}

Assistant:

xmrig::Client::Tls::Tls(Client *client) :
    m_ready(false),
    m_buf(),
    m_fingerprint(),
    m_client(client),
    m_ssl(nullptr)
{
    m_ctx = SSL_CTX_new(SSLv23_method());
    assert(m_ctx != nullptr);

    if (!m_ctx) {
        return;
    }

    m_writeBio = BIO_new(BIO_s_mem());
    m_readBio  = BIO_new(BIO_s_mem());
    SSL_CTX_set_options(m_ctx, SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3);
}